

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test::
~TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test
          (TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test *this)

{
  TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test *this_local;
  
  ~TEST_MockCallTest_OnObjectIgnored_InitialMatchDiscarded_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockCallTest, OnObjectIgnored_InitialMatchDiscarded)
{
    void* objectPtr1 = (void*) 0x001;
    void* objectPtr2 = (void*) 0x002;

    mock().expectOneCall("boo");
    mock().expectOneCall("boo").withBoolParameter("p", true);
    mock().actualCall("boo").onObject(objectPtr2).withBoolParameter("p", true);
    mock().actualCall("boo").onObject(objectPtr1);
}